

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_lit.c
# Opt level: O0

int arg_lit_scanfn(arg_lit *parent,char *argval)

{
  int local_1c;
  int errorcode;
  char *argval_local;
  arg_lit *parent_local;
  
  local_1c = 0;
  if (parent->count < (parent->hdr).maxcount) {
    parent->count = parent->count + 1;
  }
  else {
    local_1c = 2;
  }
  return local_1c;
}

Assistant:

static int arg_lit_scanfn(struct arg_lit* parent, const char* argval) {
    int errorcode = 0;
    if (parent->count < parent->hdr.maxcount)
        parent->count++;
    else
        errorcode = ARG_ERR_MAXCOUNT;

    ARG_TRACE(("%s:scanfn(%p,%s) returns %d\n", __FILE__, parent, argval, errorcode));
    return errorcode;
}